

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

tuple<SudokuGitter,_SudokuGitter> *
mainBigSudoku(tuple<SudokuGitter,_SudokuGitter> *__return_storage_ptr__,int elements)

{
  SudokuGitter gitter1;
  SudokuGitter gitter2;
  SudokuGenerator generator;
  SudokuGitter local_100;
  SudokuGitter local_d8;
  _Tuple_impl<0UL,_SudokuGitter,_SudokuGitter> local_b0;
  SudokuGenerator local_60;
  
  SudokuGenerator::SudokuGenerator(&local_60,elements);
  SudokuGenerator::generateNewBig(__return_storage_ptr__,&local_60);
  SudokuGitter::SudokuGitter
            (&local_100,
             &(__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
              super__Head_base<0UL,_SudokuGitter,_false>._M_head_impl);
  SudokuGitter::SudokuGitter(&local_d8,(SudokuGitter *)__return_storage_ptr__);
  SudokuGitter::getSolvable((SudokuGitter *)&local_b0,&local_100);
  SudokuGitter::operator=(&local_100,(SudokuGitter *)&local_b0);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector((vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
             *)&local_b0);
  SudokuGitter::getSolvable((SudokuGitter *)&local_b0,&local_d8);
  SudokuGitter::operator=(&local_d8,(SudokuGitter *)&local_b0);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector((vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
             *)&local_b0);
  std::_Tuple_impl<0ul,SudokuGitter,SudokuGitter>::_Tuple_impl<SudokuGitter&,SudokuGitter&,void>
            ((_Tuple_impl<0ul,SudokuGitter,SudokuGitter> *)&local_b0,&local_100,&local_d8);
  std::tuple<SudokuGitter,_SudokuGitter>::operator=(__return_storage_ptr__,(type)&local_b0);
  std::_Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>::~_Tuple_impl(&local_b0);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_d8.cells);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_100.cells);
  SudokuGenerator::~SudokuGenerator(&local_60);
  return __return_storage_ptr__;
}

Assistant:

tuple<SudokuGitter, SudokuGitter> mainBigSudoku(int elements){
    SudokuGenerator generator = SudokuGenerator(elements);
    tuple<SudokuGitter, SudokuGitter> bigGitter = generator.generateNewBig();
    SudokuGitter gitter1 = std::get<0>(bigGitter);
    SudokuGitter gitter2 = std::get<1>(bigGitter);
    gitter1 = gitter1.getSolvable();
    gitter2 = gitter2.getSolvable();
    bigGitter = std::make_tuple(gitter1, gitter2);
    return bigGitter;
}